

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

uint crnlib::dxt1_block::get_block_colors3(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  uVar7 = CONCAT62(in_register_00000032,color0);
  uVar5 = CONCAT62(in_register_00000012,color1);
  uVar3 = (uint)uVar7;
  uVar1 = ((uVar3 & 0x1c) >> 2) + uVar3 * 8;
  uVar2 = (uint)(uVar7 >> 9) & 3 | (uint)(uVar7 >> 3) & 0xfc;
  iVar9 = (uVar3 >> 0xd) + ((uint)(uVar7 >> 0xb) & 0x1fffff) * 8;
  uVar3 = (uint)uVar5;
  uVar6 = ((uVar3 & 0x1c) >> 2) + uVar3 * 8;
  uVar8 = (uint)(uVar5 >> 9) & 3 | (uint)(uVar5 >> 3) & 0xfc;
  iVar4 = (uVar3 >> 0xd) + ((uint)(uVar5 >> 0xb) & 0x1fffff) * 8;
  (pDst->field_0).field_0.r = (uchar)iVar9;
  (pDst->field_0).field_0.g = (uchar)uVar2;
  (pDst->field_0).field_0.b = (uchar)uVar1;
  (pDst->field_0).field_0.a = 0xff;
  pDst[1].field_0.field_0.r = (uchar)iVar4;
  pDst[1].field_0.field_0.g = (uchar)uVar8;
  pDst[1].field_0.field_0.b = (uchar)uVar6;
  pDst[1].field_0.field_0.a = 0xff;
  pDst[2].field_0.field_0.r = (uchar)((uint)(iVar4 + iVar9) >> 1);
  pDst[2].field_0.field_0.g = (uchar)(uVar8 + uVar2 >> 1);
  pDst[2].field_0.field_0.b = (uchar)((uVar6 & 0xff) + (uVar1 & 0xff) >> 1);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  return 3;
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha) {
  uint b = packed_color & 31U;
  uint g = (packed_color >> 5U) & 63U;
  uint r = (packed_color >> 11U) & 31U;

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 2U) | (g >> 4U);
    r = (r << 3U) | (r >> 2U);
  }

  return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
}